

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O2

void __thiscall
RecoveryTest_SigsegvTest_Test::~RecoveryTest_SigsegvTest_Test(RecoveryTest_SigsegvTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (RecoveryTest, SigsegvTest) {
#ifdef _WIN32
    const char regex[] = "::SigsegvHandler";
#else
    const char regex[] = "posixSignalHandler";
#endif

    ASSERT_EXIT(RaiseSigsegv(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGSEGV), regex);
}